

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall
ncnn::Padding::forward
          (Padding *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  const_reference pvVar5;
  const_reference this_00;
  int *piVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Mat borderm;
  Mat m;
  int q;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  int *param_data;
  int _right;
  int _left;
  int _bottom;
  int _top;
  Mat *top_blob;
  Mat *reference_blob;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  Mat *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  Mat *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Mat *in_stack_ffffffffffffff38;
  Mat *in_stack_ffffffffffffff40;
  int local_7c;
  int local_4;
  
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  piVar6 = Mat::operator_cast_to_int_(this_00);
  if ((((*piVar6 == 0) && (piVar6[1] == 0)) && (piVar6[2] == 0)) && (piVar6[3] == 0)) {
    Mat::operator=(in_stack_fffffffffffffef8,
                   (Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_4 = 0;
  }
  else {
    iVar1 = pvVar5->c;
    iVar2 = pvVar5->dims;
    sVar3 = pvVar5->elemsize;
    if (iVar2 == 1) {
      Mat::create(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (Allocator *)in_stack_fffffffffffffef8);
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (bVar4) {
        local_4 = -100;
      }
      else {
        if (sVar3 == 1) {
          copy_make_border_image<signed_char>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     (char)((uint)in_stack_ffffffffffffff28 >> 0x18));
        }
        else if (sVar3 == 4) {
          copy_make_border_image<float>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        }
        local_4 = 0;
      }
    }
    else if (iVar2 == 2) {
      Mat::create(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (Allocator *)in_stack_fffffffffffffef8);
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (bVar4) {
        local_4 = -100;
      }
      else {
        if (sVar3 == 1) {
          copy_make_border_image<signed_char>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     (char)((uint)in_stack_ffffffffffffff28 >> 0x18));
        }
        else if (sVar3 == 4) {
          copy_make_border_image<float>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        }
        local_4 = 0;
      }
    }
    else if (iVar2 == 3) {
      Mat::create(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                  in_stack_ffffffffffffff04,(size_t)in_stack_fffffffffffffef8,
                  (Allocator *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (bVar4) {
        local_4 = -100;
      }
      else {
        for (local_7c = 0; local_7c < iVar1; local_7c = local_7c + 1) {
          Mat::channel(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
          Mat::channel(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
          if (sVar3 == 1) {
            copy_make_border_image<signed_char>
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34
                       ,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                       (char)((uint)in_stack_ffffffffffffff28 >> 0x18));
          }
          else if (sVar3 == 4) {
            copy_make_border_image<float>
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34
                       ,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                       in_stack_ffffffffffffff28);
          }
          Mat::~Mat((Mat *)0x1a08ac);
          Mat::~Mat((Mat *)0x1a08b6);
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Padding::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    int _top;
    int _bottom;
    int _left;
    int _right;
    {
        const int* param_data = reference_blob;

        _top = param_data[0];
        _bottom = param_data[1];
        _left = param_data[2];
        _right = param_data[3];
    }

    if (_top == 0 && _bottom == 0 && _left == 0 && _right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + _left + _right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, _left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, _left, type, value);

        return 0;
    }

    int outh = h + _top + _bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, _top, _left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, _top, _left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, _top, _left, type, value);
            else if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, _top, _left, type, value);
        }

        return 0;
    }

    return 0;
}